

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChAbsorbed_Power_Vertical::Config(ChAbsorbed_Power_Vertical *this,double step)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar12 [32];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = step;
  auVar8._8_8_ = 0x4036000000000000;
  auVar8._0_8_ = 0x4036000000000000;
  auVar6._8_8_ = step;
  auVar6._0_8_ = step;
  auVar2._0_8_ = step * 24.0;
  auVar2._8_8_ = step * -24.0;
  this->m_Ts = step;
  auVar8 = vfmadd213pd_fma(auVar8,auVar6,_DAT_00e79800);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = step * 750.0;
  auVar10 = vfmadd213sd_fma(auVar13,auVar4._0_16_,ZEXT816(0xc010000000000000));
  auVar12 = vpermpd_avx2(ZEXT1632(CONCAT88(step * -29.0,step * 29.0)),0x50);
  auVar3._8_8_ = step * 375.0;
  auVar3._0_8_ = step * 375.0;
  auVar3 = vfmadd213pd_fma(auVar3,auVar6,auVar2);
  auVar1._8_8_ = 0x4000000000000000;
  auVar1._0_8_ = 0x4000000000000000;
  auVar2 = vaddpd_avx512vl(auVar3,auVar1);
  auVar7._0_8_ = auVar12._0_8_ * auVar8._0_8_;
  auVar7._8_8_ = auVar12._8_8_ * auVar8._8_8_;
  auVar7._16_8_ = auVar12._16_8_ * auVar8._0_8_;
  auVar7._24_8_ = auVar12._24_8_ * auVar8._8_8_;
  auVar9._8_8_ = 0x404f800000000000;
  auVar9._0_8_ = 0x404f800000000000;
  auVar6 = vfmadd213pd_fma(auVar9,auVar6,_DAT_00ef8be0);
  auVar1 = vunpcklpd_avx(auVar10,auVar6);
  auVar8 = vshufpd_avx(auVar6,auVar10,1);
  auVar3 = vshufpd_avx(auVar6,auVar6,1);
  auVar10._0_8_ = auVar1._0_8_ * auVar8._0_8_;
  auVar10._8_8_ = auVar1._8_8_ * auVar8._8_8_;
  dVar5 = auVar3._0_8_ * auVar2._0_8_;
  auVar8 = vfmadd231pd_fma(auVar10,auVar6,auVar2);
  auVar3 = vshufpd_avx(auVar2,auVar2,1);
  auVar11._8_8_ = dVar5;
  auVar11._0_8_ = dVar5;
  auVar12._16_8_ = dVar5;
  auVar12._0_16_ = auVar11;
  auVar12._24_8_ = dVar5;
  auVar12 = vdivpd_avx(auVar7,auVar12);
  auVar8 = vdivpd_avx(auVar8,auVar11);
  this->m_b0 = (double)auVar12._0_8_;
  this->m_b1 = (double)auVar12._8_8_;
  this->m_b2 = (double)auVar12._16_8_;
  this->m_b3 = (double)auVar12._24_8_;
  this->m_a1 = (double)auVar8._0_8_;
  this->m_a2 = (double)auVar8._8_8_;
  this->m_a3 = (auVar6._0_8_ * auVar3._0_8_) / dVar5;
  this->m_a0 = 1.0;
  this->m_u_hist1 = 0.0;
  this->m_u_hist2 = 0.0;
  this->m_u_hist3 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_u_hist3 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_y_hist2 = 0.0;
  this->m_y_hist3 = 0.0;
  return;
}

Assistant:

void ChAbsorbed_Power_Vertical::Config(double step) {
    m_Ts = step;

    m_b0 = (29.0 * m_Ts * (22.0 * m_Ts + 1.0));
    m_b1 = (29.0 * m_Ts * (22.0 * m_Ts - 1.0));
    m_b2 = (-29.0 * m_Ts * (22.0 * m_Ts + 1.0));
    m_b3 = -29.0 * m_Ts * (22.0 * m_Ts - 1.0);

    m_a0 = ((63.0 * m_Ts + 2.0) * (375.0 * m_Ts * m_Ts + 24.0 * m_Ts + 2.0));
    m_a1 = ((63.0 * m_Ts - 2.0) * (375.0 * m_Ts * m_Ts + 24.0 * m_Ts + 2.0) +
            (63.0 * m_Ts + 2.0) * (750.0 * m_Ts * m_Ts - 4.0));
    m_a2 = ((63.0 * m_Ts + 2.0) * (375.0 * m_Ts * m_Ts - 24.0 * m_Ts + 2.0) +
            (63.0 * m_Ts - 2.0) * (750.0 * m_Ts * m_Ts - 4.0));
    m_a3 = (63.0 * m_Ts - 2.0) * (375.0 * m_Ts * m_Ts - 24.0 * m_Ts + 2.0);

    m_b0 /= m_a0;
    m_b1 /= m_a0;
    m_b2 /= m_a0;
    m_b3 /= m_a0;

    m_a1 /= m_a0;
    m_a2 /= m_a0;
    m_a3 /= m_a0;
    m_a0 = 1.0;

    Reset();
}